

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O1

void Transform_SSE2(int16_t *in,uint8_t *dst,int do_two)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [15];
  unkuint9 Var30;
  undefined1 auVar31 [11];
  undefined1 auVar32 [13];
  undefined1 auVar33 [15];
  undefined1 auVar34 [11];
  undefined1 auVar35 [15];
  undefined1 auVar36 [11];
  undefined1 auVar37 [13];
  undefined1 auVar38 [15];
  undefined1 auVar39 [11];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [12];
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  int16_t iVar53;
  int16_t iVar54;
  int16_t iVar55;
  int16_t iVar56;
  undefined4 uVar57;
  int16_t iVar59;
  int16_t iVar60;
  undefined1 auVar58 [13];
  int16_t iVar61;
  int16_t iVar62;
  undefined4 uVar63;
  undefined1 auVar64 [13];
  short sVar65;
  undefined4 uVar66;
  undefined1 auVar67 [13];
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  undefined1 auVar68 [16];
  short sVar70;
  short sVar76;
  undefined1 auVar69 [16];
  undefined4 uVar77;
  undefined1 auVar78 [13];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  short sVar81;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  undefined1 auVar82 [16];
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  undefined1 auVar90 [16];
  short sVar98;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  short sVar99;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  undefined1 auVar100 [16];
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  
  iVar53 = 0;
  iVar54 = 0;
  iVar55 = 0;
  iVar56 = 0;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(in + 4);
  iVar59 = 0;
  iVar60 = 0;
  iVar61 = 0;
  iVar62 = 0;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(in + 0xc);
  if (do_two != 0) {
    iVar53 = in[0x14];
    iVar54 = in[0x15];
    iVar55 = in[0x16];
    iVar56 = in[0x17];
    auVar68._8_8_ = *(undefined8 *)(in + 0x14);
    iVar59 = in[0x1c];
    iVar60 = in[0x1d];
    iVar61 = in[0x1e];
    iVar62 = in[0x1f];
    auVar79._8_8_ = *(undefined8 *)(in + 0x1c);
  }
  sVar81 = *in + in[8];
  sVar83 = in[1] + in[9];
  sVar84 = in[2] + in[10];
  sVar85 = in[3] + in[0xb];
  sVar49 = *in - in[8];
  sVar50 = in[1] - in[9];
  sVar51 = in[2] - in[10];
  sVar52 = in[3] - in[0xb];
  auVar90 = pmulhw(auVar68,_DAT_001b77a0);
  auVar100 = pmulhw(auVar79,_DAT_001b77b0);
  sVar99 = (auVar68._0_2_ - auVar79._0_2_) + (auVar90._0_2_ - auVar100._0_2_);
  sVar101 = (auVar68._2_2_ - auVar79._2_2_) + (auVar90._2_2_ - auVar100._2_2_);
  sVar102 = (auVar68._4_2_ - auVar79._4_2_) + (auVar90._4_2_ - auVar100._4_2_);
  sVar103 = (auVar68._6_2_ - auVar79._6_2_) + (auVar90._6_2_ - auVar100._6_2_);
  sVar104 = (auVar68._8_2_ - auVar79._8_2_) + (auVar90._8_2_ - auVar100._8_2_);
  sVar105 = (auVar68._10_2_ - auVar79._10_2_) + (auVar90._10_2_ - auVar100._10_2_);
  sVar107 = (auVar68._12_2_ - auVar79._12_2_) + (auVar90._12_2_ - auVar100._12_2_);
  sVar109 = (auVar68._14_2_ - auVar79._14_2_) + (auVar90._14_2_ - auVar100._14_2_);
  auVar100 = pmulhw(auVar68,_DAT_001b77b0);
  auVar90 = pmulhw(auVar79,_DAT_001b77a0);
  sVar65 = auVar68._0_2_ + auVar79._0_2_ + auVar100._0_2_ + auVar90._0_2_;
  sVar70 = auVar68._2_2_ + auVar79._2_2_ + auVar100._2_2_ + auVar90._2_2_;
  sVar71 = auVar68._4_2_ + auVar79._4_2_ + auVar100._4_2_ + auVar90._4_2_;
  sVar72 = auVar68._6_2_ + auVar79._6_2_ + auVar100._6_2_ + auVar90._6_2_;
  sVar73 = auVar68._8_2_ + auVar79._8_2_ + auVar100._8_2_ + auVar90._8_2_;
  sVar74 = auVar68._10_2_ + auVar79._10_2_ + auVar100._10_2_ + auVar90._10_2_;
  sVar75 = auVar68._12_2_ + auVar79._12_2_ + auVar100._12_2_ + auVar90._12_2_;
  sVar76 = auVar68._14_2_ + auVar79._14_2_ + auVar100._14_2_ + auVar90._14_2_;
  sVar111 = sVar70 + sVar83;
  sVar112 = sVar71 + sVar84;
  sVar113 = sVar72 + sVar85;
  sVar114 = sVar74 + iVar54 + iVar60;
  sVar115 = sVar75 + iVar55 + iVar61;
  sVar116 = sVar76 + iVar56 + iVar62;
  sVar93 = sVar101 + sVar50;
  sVar94 = sVar102 + sVar51;
  sVar95 = sVar103 + sVar52;
  sVar96 = sVar105 + (iVar54 - iVar60);
  sVar97 = sVar107 + (iVar55 - iVar61);
  sVar98 = sVar109 + (iVar56 - iVar62);
  sVar50 = sVar50 - sVar101;
  sVar51 = sVar51 - sVar102;
  sVar52 = sVar52 - sVar103;
  sVar105 = (iVar54 - iVar60) - sVar105;
  sVar107 = (iVar55 - iVar61) - sVar107;
  sVar109 = (iVar56 - iVar62) - sVar109;
  sVar83 = sVar83 - sVar70;
  sVar84 = sVar84 - sVar71;
  sVar85 = sVar85 - sVar72;
  sVar74 = (iVar54 + iVar60) - sVar74;
  sVar75 = (iVar55 + iVar61) - sVar75;
  sVar76 = (iVar56 + iVar62) - sVar76;
  auVar27._4_8_ =
       (long)(((unkuint10)(uint6)(((unkuint10)CONCAT22(sVar95,sVar113) << 0x30) >> 0x20) << 0x20) >>
             0x10);
  auVar27._2_2_ = sVar93;
  auVar27._0_2_ = sVar111;
  auVar91._0_8_ = auVar27._0_8_ << 0x20;
  auVar28._4_8_ =
       (long)(((unkuint10)(uint6)(((unkuint10)CONCAT22(sVar85,sVar52) << 0x30) >> 0x20) << 0x20) >>
             0x10);
  auVar28._2_2_ = sVar83;
  auVar28._0_2_ = sVar50;
  auVar48._10_2_ = sVar74;
  auVar48._8_2_ = sVar105;
  auVar91._8_4_ = auVar27._0_4_;
  auVar91._12_4_ = auVar28._0_4_;
  auVar48._4_4_ = CONCAT22(sVar96,sVar114);
  auVar48._0_4_ = CONCAT22(sVar96,sVar114);
  auVar80._4_4_ = CONCAT22(sVar85,sVar52);
  auVar80._0_4_ = CONCAT22(sVar95,sVar113);
  auVar80._12_4_ = (int)(CONCAT24(sVar76,CONCAT22(sVar109,sVar75)) >> 0x10);
  auVar80._8_4_ = (int)(CONCAT24(sVar98,CONCAT22(sVar116,sVar97)) >> 0x10);
  auVar92._8_8_ = auVar48._4_8_;
  auVar92._0_8_ = auVar91._8_8_;
  sVar70 = sVar65 + sVar81 + 4;
  sVar71 = sVar99 + sVar49 + 4;
  sVar49 = (sVar49 - sVar99) + 4;
  sVar65 = (sVar81 - sVar65) + 4;
  sVar72 = sVar73 + iVar53 + iVar59 + 4;
  sVar81 = sVar104 + (iVar53 - iVar59) + 4;
  sVar99 = ((iVar53 - iVar59) - sVar104) + 4;
  sVar73 = ((iVar53 + iVar59) - sVar73) + 4;
  sVar101 = sVar70 + sVar112;
  sVar102 = sVar71 + sVar94;
  sVar103 = sVar49 + sVar51;
  sVar104 = sVar65 + sVar84;
  sVar86 = sVar72 + sVar115;
  sVar87 = sVar81 + sVar97;
  sVar88 = sVar99 + sVar107;
  sVar89 = sVar73 + sVar75;
  sVar70 = sVar70 - sVar112;
  sVar71 = sVar71 - sVar94;
  sVar49 = sVar49 - sVar51;
  sVar65 = sVar65 - sVar84;
  sVar72 = sVar72 - sVar115;
  sVar81 = sVar81 - sVar97;
  sVar99 = sVar99 - sVar107;
  sVar73 = sVar73 - sVar75;
  auVar68 = pmulhw(auVar92,_DAT_001b77a0);
  auVar79 = pmulhw(auVar80,_DAT_001b77b0);
  sVar84 = (sVar111 - sVar113) + (auVar68._0_2_ - auVar79._0_2_);
  sVar94 = (sVar93 - sVar95) + (auVar68._2_2_ - auVar79._2_2_);
  sVar97 = (sVar50 - sVar52) + (auVar68._4_2_ - auVar79._4_2_);
  sVar112 = (sVar83 - sVar85) + (auVar68._6_2_ - auVar79._6_2_);
  sVar115 = (sVar114 - sVar116) + (auVar68._8_2_ - auVar79._8_2_);
  sVar106 = (sVar96 - sVar98) + (auVar68._10_2_ - auVar79._10_2_);
  sVar108 = (sVar105 - sVar109) + (auVar68._12_2_ - auVar79._12_2_);
  sVar110 = (sVar74 - sVar76) + (auVar68._14_2_ - auVar79._14_2_);
  auVar79 = pmulhw(_DAT_001b77b0,auVar92);
  auVar68 = pmulhw(_DAT_001b77a0,auVar80);
  sVar51 = sVar113 + sVar111 + auVar68._0_2_ + auVar79._0_2_;
  sVar107 = sVar95 + sVar93 + auVar68._2_2_ + auVar79._2_2_;
  sVar50 = sVar52 + sVar50 + auVar68._4_2_ + auVar79._4_2_;
  sVar52 = sVar85 + sVar83 + auVar68._6_2_ + auVar79._6_2_;
  sVar75 = sVar116 + sVar114 + auVar68._8_2_ + auVar79._8_2_;
  sVar83 = sVar98 + sVar96 + auVar68._10_2_ + auVar79._10_2_;
  sVar105 = sVar109 + sVar105 + auVar68._12_2_ + auVar79._12_2_;
  sVar109 = sVar76 + sVar74 + auVar68._14_2_ + auVar79._14_2_;
  auVar90._0_2_ = sVar101 + sVar51;
  auVar90._2_2_ = sVar102 + sVar107;
  auVar90._4_2_ = sVar103 + sVar50;
  auVar90._6_2_ = sVar104 + sVar52;
  auVar90._8_2_ = sVar86 + sVar75;
  auVar90._10_2_ = sVar87 + sVar83;
  auVar90._12_2_ = sVar88 + sVar105;
  auVar90._14_2_ = sVar89 + sVar109;
  auVar100._0_2_ = sVar70 + sVar84;
  auVar100._2_2_ = sVar71 + sVar94;
  auVar100._4_2_ = sVar49 + sVar97;
  auVar100._6_2_ = sVar65 + sVar112;
  auVar100._8_2_ = sVar72 + sVar115;
  auVar100._10_2_ = sVar81 + sVar106;
  auVar100._12_2_ = sVar99 + sVar108;
  auVar100._14_2_ = sVar73 + sVar110;
  auVar69._0_2_ = sVar70 - sVar84;
  auVar69._2_2_ = sVar71 - sVar94;
  auVar69._4_2_ = sVar49 - sVar97;
  auVar69._6_2_ = sVar65 - sVar112;
  auVar69._8_2_ = sVar72 - sVar115;
  auVar69._10_2_ = sVar81 - sVar106;
  auVar69._12_2_ = sVar99 - sVar108;
  auVar69._14_2_ = sVar73 - sVar110;
  auVar82._0_2_ = sVar101 - sVar51;
  auVar82._2_2_ = sVar102 - sVar107;
  auVar82._4_2_ = sVar103 - sVar50;
  auVar82._6_2_ = sVar104 - sVar52;
  auVar82._8_2_ = sVar86 - sVar75;
  auVar82._10_2_ = sVar87 - sVar83;
  auVar82._12_2_ = sVar88 - sVar105;
  auVar82._14_2_ = sVar89 - sVar109;
  auVar68 = psraw(auVar90,3);
  auVar79 = psraw(auVar100,3);
  auVar90 = psraw(auVar69,3);
  auVar100 = psraw(auVar82,3);
  if (do_two == 0) {
    auVar58 = ZEXT413(*(uint *)dst);
    auVar64 = ZEXT413(*(uint *)(dst + 0x20));
    auVar67 = ZEXT413(*(uint *)(dst + 0x40));
    auVar78 = ZEXT413(*(uint *)(dst + 0x60));
  }
  else {
    auVar58._8_5_ = 0;
    auVar58._0_8_ = *(ulong *)dst;
    auVar64._8_5_ = 0;
    auVar64._0_8_ = *(ulong *)(dst + 0x20);
    auVar67._8_5_ = 0;
    auVar67._0_8_ = *(ulong *)(dst + 0x40);
    auVar78._8_5_ = 0;
    auVar78._0_8_ = *(ulong *)(dst + 0x60);
  }
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar58;
  auVar4[0xe] = auVar58[7];
  auVar8[0xc] = auVar58[6];
  auVar8._0_12_ = auVar58._0_12_;
  auVar8._13_2_ = auVar4._13_2_;
  auVar12[0xb] = 0;
  auVar12._0_11_ = auVar58._0_11_;
  auVar12._12_3_ = auVar8._12_3_;
  auVar16[10] = auVar58[5];
  auVar16._0_10_ = auVar58._0_10_;
  auVar16._11_4_ = auVar12._11_4_;
  auVar20[9] = 0;
  auVar20._0_9_ = auVar58._0_9_;
  auVar20._10_5_ = auVar16._10_5_;
  auVar24[8] = auVar58[4];
  auVar24._0_8_ = auVar58._0_8_;
  auVar24._9_6_ = auVar20._9_6_;
  auVar29._7_8_ = 0;
  auVar29._0_7_ = auVar24._8_7_;
  Var30 = CONCAT81(SUB158(auVar29 << 0x40,7),auVar58[3]);
  auVar40._9_6_ = 0;
  auVar40._0_9_ = Var30;
  auVar31._1_10_ = SUB1510(auVar40 << 0x30,5);
  auVar31[0] = auVar58[2];
  auVar41._11_4_ = 0;
  auVar41._0_11_ = auVar31;
  auVar32._1_12_ = SUB1512(auVar41 << 0x20,3);
  auVar32[0] = auVar58[1];
  sVar49 = (ushort)auVar58[0] + auVar68._0_2_;
  sVar50 = auVar32._0_2_ + auVar79._0_2_;
  sVar51 = auVar31._0_2_ + auVar90._0_2_;
  sVar52 = (short)Var30 + auVar100._0_2_;
  sVar105 = auVar24._8_2_ + auVar68._8_2_;
  sVar107 = auVar16._10_2_ + auVar79._8_2_;
  sVar109 = auVar8._12_2_ + auVar90._8_2_;
  sVar65 = (auVar4._13_2_ >> 8) + auVar100._8_2_;
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar64;
  auVar1[0xe] = auVar64[7];
  auVar5[0xc] = auVar64[6];
  auVar5._0_12_ = auVar64._0_12_;
  auVar5._13_2_ = auVar1._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar64._0_11_;
  auVar9._12_3_ = auVar5._12_3_;
  auVar13[10] = auVar64[5];
  auVar13._0_10_ = auVar64._0_10_;
  auVar13._11_4_ = auVar9._11_4_;
  auVar17[9] = 0;
  auVar17._0_9_ = auVar64._0_9_;
  auVar17._10_5_ = auVar13._10_5_;
  auVar21[8] = auVar64[4];
  auVar21._0_8_ = auVar64._0_8_;
  auVar21._9_6_ = auVar17._9_6_;
  auVar33._7_8_ = 0;
  auVar33._0_7_ = auVar21._8_7_;
  Var30 = CONCAT81(SUB158(auVar33 << 0x40,7),auVar64[3]);
  auVar42._9_6_ = 0;
  auVar42._0_9_ = Var30;
  auVar34._1_10_ = SUB1510(auVar42 << 0x30,5);
  auVar34[0] = auVar64[2];
  auVar43._11_4_ = 0;
  auVar43._0_11_ = auVar34;
  auVar25[2] = auVar64[1];
  auVar25._0_2_ = auVar64._0_2_;
  auVar25._3_12_ = SUB1512(auVar43 << 0x20,3);
  sVar70 = (auVar64._0_2_ & 0xff) + auVar68._2_2_;
  sVar71 = auVar25._2_2_ + auVar79._2_2_;
  sVar72 = auVar34._0_2_ + auVar90._2_2_;
  sVar73 = (short)Var30 + auVar100._2_2_;
  sVar74 = auVar21._8_2_ + auVar68._10_2_;
  sVar81 = auVar13._10_2_ + auVar79._10_2_;
  sVar75 = auVar5._12_2_ + auVar90._10_2_;
  sVar99 = (auVar1._13_2_ >> 8) + auVar100._10_2_;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar67;
  auVar2[0xe] = auVar67[7];
  auVar6[0xc] = auVar67[6];
  auVar6._0_12_ = auVar67._0_12_;
  auVar6._13_2_ = auVar2._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar67._0_11_;
  auVar10._12_3_ = auVar6._12_3_;
  auVar14[10] = auVar67[5];
  auVar14._0_10_ = auVar67._0_10_;
  auVar14._11_4_ = auVar10._11_4_;
  auVar18[9] = 0;
  auVar18._0_9_ = auVar67._0_9_;
  auVar18._10_5_ = auVar14._10_5_;
  auVar22[8] = auVar67[4];
  auVar22._0_8_ = auVar67._0_8_;
  auVar22._9_6_ = auVar18._9_6_;
  auVar35._7_8_ = 0;
  auVar35._0_7_ = auVar22._8_7_;
  Var30 = CONCAT81(SUB158(auVar35 << 0x40,7),auVar67[3]);
  auVar44._9_6_ = 0;
  auVar44._0_9_ = Var30;
  auVar36._1_10_ = SUB1510(auVar44 << 0x30,5);
  auVar36[0] = auVar67[2];
  auVar45._11_4_ = 0;
  auVar45._0_11_ = auVar36;
  auVar37._1_12_ = SUB1512(auVar45 << 0x20,3);
  auVar37[0] = auVar67[1];
  sVar76 = (ushort)auVar67[0] + auVar68._4_2_;
  sVar83 = auVar37._0_2_ + auVar79._4_2_;
  sVar101 = auVar36._0_2_ + auVar90._4_2_;
  sVar102 = (short)Var30 + auVar100._4_2_;
  sVar84 = auVar22._8_2_ + auVar68._12_2_;
  sVar103 = auVar14._10_2_ + auVar79._12_2_;
  sVar85 = auVar6._12_2_ + auVar90._12_2_;
  sVar104 = (auVar2._13_2_ >> 8) + auVar100._12_2_;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar78;
  auVar3[0xe] = auVar78[7];
  auVar7[0xc] = auVar78[6];
  auVar7._0_12_ = auVar78._0_12_;
  auVar7._13_2_ = auVar3._13_2_;
  auVar11[0xb] = 0;
  auVar11._0_11_ = auVar78._0_11_;
  auVar11._12_3_ = auVar7._12_3_;
  auVar15[10] = auVar78[5];
  auVar15._0_10_ = auVar78._0_10_;
  auVar15._11_4_ = auVar11._11_4_;
  auVar19[9] = 0;
  auVar19._0_9_ = auVar78._0_9_;
  auVar19._10_5_ = auVar15._10_5_;
  auVar23[8] = auVar78[4];
  auVar23._0_8_ = auVar78._0_8_;
  auVar23._9_6_ = auVar19._9_6_;
  auVar38._7_8_ = 0;
  auVar38._0_7_ = auVar23._8_7_;
  Var30 = CONCAT81(SUB158(auVar38 << 0x40,7),auVar78[3]);
  auVar46._9_6_ = 0;
  auVar46._0_9_ = Var30;
  auVar39._1_10_ = SUB1510(auVar46 << 0x30,5);
  auVar39[0] = auVar78[2];
  auVar47._11_4_ = 0;
  auVar47._0_11_ = auVar39;
  auVar26[2] = auVar78[1];
  auVar26._0_2_ = auVar78._0_2_;
  auVar26._3_12_ = SUB1512(auVar47 << 0x20,3);
  sVar86 = (auVar78._0_2_ & 0xff) + auVar68._6_2_;
  sVar87 = auVar26._2_2_ + auVar79._6_2_;
  sVar88 = auVar39._0_2_ + auVar90._6_2_;
  sVar89 = (short)Var30 + auVar100._6_2_;
  sVar93 = auVar23._8_2_ + auVar68._14_2_;
  sVar94 = auVar15._10_2_ + auVar79._14_2_;
  sVar95 = auVar7._12_2_ + auVar90._14_2_;
  sVar96 = (auVar3._13_2_ >> 8) + auVar100._14_2_;
  uVar57 = CONCAT13((0 < sVar52) * (sVar52 < 0x100) * (char)sVar52 - (0xff < sVar52),
                    CONCAT12((0 < sVar51) * (sVar51 < 0x100) * (char)sVar51 - (0xff < sVar51),
                             CONCAT11((0 < sVar50) * (sVar50 < 0x100) * (char)sVar50 -
                                      (0xff < sVar50),
                                      (0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 -
                                      (0xff < sVar49))));
  uVar63 = CONCAT13((0 < sVar73) * (sVar73 < 0x100) * (char)sVar73 - (0xff < sVar73),
                    CONCAT12((0 < sVar72) * (sVar72 < 0x100) * (char)sVar72 - (0xff < sVar72),
                             CONCAT11((0 < sVar71) * (sVar71 < 0x100) * (char)sVar71 -
                                      (0xff < sVar71),
                                      (0 < sVar70) * (sVar70 < 0x100) * (char)sVar70 -
                                      (0xff < sVar70))));
  uVar66 = CONCAT13((0 < sVar102) * (sVar102 < 0x100) * (char)sVar102 - (0xff < sVar102),
                    CONCAT12((0 < sVar101) * (sVar101 < 0x100) * (char)sVar101 - (0xff < sVar101),
                             CONCAT11((0 < sVar83) * (sVar83 < 0x100) * (char)sVar83 -
                                      (0xff < sVar83),
                                      (0 < sVar76) * (sVar76 < 0x100) * (char)sVar76 -
                                      (0xff < sVar76))));
  uVar77 = CONCAT13((0 < sVar89) * (sVar89 < 0x100) * (char)sVar89 - (0xff < sVar89),
                    CONCAT12((0 < sVar88) * (sVar88 < 0x100) * (char)sVar88 - (0xff < sVar88),
                             CONCAT11((0 < sVar87) * (sVar87 < 0x100) * (char)sVar87 -
                                      (0xff < sVar87),
                                      (0 < sVar86) * (sVar86 < 0x100) * (char)sVar86 -
                                      (0xff < sVar86))));
  if (do_two != 0) {
    *(ulong *)dst =
         CONCAT17((0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65),
                  CONCAT16((0 < sVar109) * (sVar109 < 0x100) * (char)sVar109 - (0xff < sVar109),
                           CONCAT15((0 < sVar107) * (sVar107 < 0x100) * (char)sVar107 -
                                    (0xff < sVar107),
                                    CONCAT14((0 < sVar105) * (sVar105 < 0x100) * (char)sVar105 -
                                             (0xff < sVar105),uVar57))));
    *(ulong *)(dst + 0x20) =
         CONCAT17((0 < sVar99) * (sVar99 < 0x100) * (char)sVar99 - (0xff < sVar99),
                  CONCAT16((0 < sVar75) * (sVar75 < 0x100) * (char)sVar75 - (0xff < sVar75),
                           CONCAT15((0 < sVar81) * (sVar81 < 0x100) * (char)sVar81 - (0xff < sVar81)
                                    ,CONCAT14((0 < sVar74) * (sVar74 < 0x100) * (char)sVar74 -
                                              (0xff < sVar74),uVar63))));
    *(ulong *)(dst + 0x40) =
         CONCAT17((0 < sVar104) * (sVar104 < 0x100) * (char)sVar104 - (0xff < sVar104),
                  CONCAT16((0 < sVar85) * (sVar85 < 0x100) * (char)sVar85 - (0xff < sVar85),
                           CONCAT15((0 < sVar103) * (sVar103 < 0x100) * (char)sVar103 -
                                    (0xff < sVar103),
                                    CONCAT14((0 < sVar84) * (sVar84 < 0x100) * (char)sVar84 -
                                             (0xff < sVar84),uVar66))));
    *(ulong *)(dst + 0x60) =
         CONCAT17((0 < sVar96) * (sVar96 < 0x100) * (char)sVar96 - (0xff < sVar96),
                  CONCAT16((0 < sVar95) * (sVar95 < 0x100) * (char)sVar95 - (0xff < sVar95),
                           CONCAT15((0 < sVar94) * (sVar94 < 0x100) * (char)sVar94 - (0xff < sVar94)
                                    ,CONCAT14((0 < sVar93) * (sVar93 < 0x100) * (char)sVar93 -
                                              (0xff < sVar93),uVar77))));
    return;
  }
  *(undefined4 *)dst = uVar57;
  *(undefined4 *)(dst + 0x20) = uVar63;
  *(undefined4 *)(dst + 0x40) = uVar66;
  *(undefined4 *)(dst + 0x60) = uVar77;
  return;
}

Assistant:

static void Transform_SSE2(const int16_t* WEBP_RESTRICT in,
                           uint8_t* WEBP_RESTRICT dst, int do_two) {
  // This implementation makes use of 16-bit fixed point versions of two
  // multiply constants:
  //    K1 = sqrt(2) * cos (pi/8) ~= 85627 / 2^16
  //    K2 = sqrt(2) * sin (pi/8) ~= 35468 / 2^16
  //
  // To be able to use signed 16-bit integers, we use the following trick to
  // have constants within range:
  // - Associated constants are obtained by subtracting the 16-bit fixed point
  //   version of one:
  //      k = K - (1 << 16)  =>  K = k + (1 << 16)
  //      K1 = 85267  =>  k1 =  20091
  //      K2 = 35468  =>  k2 = -30068
  // - The multiplication of a variable by a constant become the sum of the
  //   variable and the multiplication of that variable by the associated
  //   constant:
  //      (x * K) >> 16 = (x * (k + (1 << 16))) >> 16 = ((x * k ) >> 16) + x
  const __m128i k1 = _mm_set1_epi16(20091);
  const __m128i k2 = _mm_set1_epi16(-30068);
  __m128i T0, T1, T2, T3;

  // Load and concatenate the transform coefficients (we'll do two transforms
  // in parallel). In the case of only one transform, the second half of the
  // vectors will just contain random value we'll never use nor store.
  __m128i in0, in1, in2, in3;
  {
    in0 = _mm_loadl_epi64((const __m128i*)&in[0]);
    in1 = _mm_loadl_epi64((const __m128i*)&in[4]);
    in2 = _mm_loadl_epi64((const __m128i*)&in[8]);
    in3 = _mm_loadl_epi64((const __m128i*)&in[12]);
    // a00 a10 a20 a30   x x x x
    // a01 a11 a21 a31   x x x x
    // a02 a12 a22 a32   x x x x
    // a03 a13 a23 a33   x x x x
    if (do_two) {
      const __m128i inB0 = _mm_loadl_epi64((const __m128i*)&in[16]);
      const __m128i inB1 = _mm_loadl_epi64((const __m128i*)&in[20]);
      const __m128i inB2 = _mm_loadl_epi64((const __m128i*)&in[24]);
      const __m128i inB3 = _mm_loadl_epi64((const __m128i*)&in[28]);
      in0 = _mm_unpacklo_epi64(in0, inB0);
      in1 = _mm_unpacklo_epi64(in1, inB1);
      in2 = _mm_unpacklo_epi64(in2, inB2);
      in3 = _mm_unpacklo_epi64(in3, inB3);
      // a00 a10 a20 a30   b00 b10 b20 b30
      // a01 a11 a21 a31   b01 b11 b21 b31
      // a02 a12 a22 a32   b02 b12 b22 b32
      // a03 a13 a23 a33   b03 b13 b23 b33
    }
  }

  // Vertical pass and subsequent transpose.
  {
    // First pass, c and d calculations are longer because of the "trick"
    // multiplications.
    const __m128i a = _mm_add_epi16(in0, in2);
    const __m128i b = _mm_sub_epi16(in0, in2);
    // c = MUL(in1, K2) - MUL(in3, K1) = MUL(in1, k2) - MUL(in3, k1) + in1 - in3
    const __m128i c1 = _mm_mulhi_epi16(in1, k2);
    const __m128i c2 = _mm_mulhi_epi16(in3, k1);
    const __m128i c3 = _mm_sub_epi16(in1, in3);
    const __m128i c4 = _mm_sub_epi16(c1, c2);
    const __m128i c = _mm_add_epi16(c3, c4);
    // d = MUL(in1, K1) + MUL(in3, K2) = MUL(in1, k1) + MUL(in3, k2) + in1 + in3
    const __m128i d1 = _mm_mulhi_epi16(in1, k1);
    const __m128i d2 = _mm_mulhi_epi16(in3, k2);
    const __m128i d3 = _mm_add_epi16(in1, in3);
    const __m128i d4 = _mm_add_epi16(d1, d2);
    const __m128i d = _mm_add_epi16(d3, d4);

    // Second pass.
    const __m128i tmp0 = _mm_add_epi16(a, d);
    const __m128i tmp1 = _mm_add_epi16(b, c);
    const __m128i tmp2 = _mm_sub_epi16(b, c);
    const __m128i tmp3 = _mm_sub_epi16(a, d);

    // Transpose the two 4x4.
    VP8Transpose_2_4x4_16b(&tmp0, &tmp1, &tmp2, &tmp3, &T0, &T1, &T2, &T3);
  }

  // Horizontal pass and subsequent transpose.
  {
    // First pass, c and d calculations are longer because of the "trick"
    // multiplications.
    const __m128i four = _mm_set1_epi16(4);
    const __m128i dc = _mm_add_epi16(T0, four);
    const __m128i a =  _mm_add_epi16(dc, T2);
    const __m128i b =  _mm_sub_epi16(dc, T2);
    // c = MUL(T1, K2) - MUL(T3, K1) = MUL(T1, k2) - MUL(T3, k1) + T1 - T3
    const __m128i c1 = _mm_mulhi_epi16(T1, k2);
    const __m128i c2 = _mm_mulhi_epi16(T3, k1);
    const __m128i c3 = _mm_sub_epi16(T1, T3);
    const __m128i c4 = _mm_sub_epi16(c1, c2);
    const __m128i c = _mm_add_epi16(c3, c4);
    // d = MUL(T1, K1) + MUL(T3, K2) = MUL(T1, k1) + MUL(T3, k2) + T1 + T3
    const __m128i d1 = _mm_mulhi_epi16(T1, k1);
    const __m128i d2 = _mm_mulhi_epi16(T3, k2);
    const __m128i d3 = _mm_add_epi16(T1, T3);
    const __m128i d4 = _mm_add_epi16(d1, d2);
    const __m128i d = _mm_add_epi16(d3, d4);

    // Second pass.
    const __m128i tmp0 = _mm_add_epi16(a, d);
    const __m128i tmp1 = _mm_add_epi16(b, c);
    const __m128i tmp2 = _mm_sub_epi16(b, c);
    const __m128i tmp3 = _mm_sub_epi16(a, d);
    const __m128i shifted0 = _mm_srai_epi16(tmp0, 3);
    const __m128i shifted1 = _mm_srai_epi16(tmp1, 3);
    const __m128i shifted2 = _mm_srai_epi16(tmp2, 3);
    const __m128i shifted3 = _mm_srai_epi16(tmp3, 3);

    // Transpose the two 4x4.
    VP8Transpose_2_4x4_16b(&shifted0, &shifted1, &shifted2, &shifted3, &T0, &T1,
                           &T2, &T3);
  }

  // Add inverse transform to 'dst' and store.
  {
    const __m128i zero = _mm_setzero_si128();
    // Load the reference(s).
    __m128i dst0, dst1, dst2, dst3;
    if (do_two) {
      // Load eight bytes/pixels per line.
      dst0 = _mm_loadl_epi64((__m128i*)(dst + 0 * BPS));
      dst1 = _mm_loadl_epi64((__m128i*)(dst + 1 * BPS));
      dst2 = _mm_loadl_epi64((__m128i*)(dst + 2 * BPS));
      dst3 = _mm_loadl_epi64((__m128i*)(dst + 3 * BPS));
    } else {
      // Load four bytes/pixels per line.
      dst0 = _mm_cvtsi32_si128(WebPMemToInt32(dst + 0 * BPS));
      dst1 = _mm_cvtsi32_si128(WebPMemToInt32(dst + 1 * BPS));
      dst2 = _mm_cvtsi32_si128(WebPMemToInt32(dst + 2 * BPS));
      dst3 = _mm_cvtsi32_si128(WebPMemToInt32(dst + 3 * BPS));
    }
    // Convert to 16b.
    dst0 = _mm_unpacklo_epi8(dst0, zero);
    dst1 = _mm_unpacklo_epi8(dst1, zero);
    dst2 = _mm_unpacklo_epi8(dst2, zero);
    dst3 = _mm_unpacklo_epi8(dst3, zero);
    // Add the inverse transform(s).
    dst0 = _mm_add_epi16(dst0, T0);
    dst1 = _mm_add_epi16(dst1, T1);
    dst2 = _mm_add_epi16(dst2, T2);
    dst3 = _mm_add_epi16(dst3, T3);
    // Unsigned saturate to 8b.
    dst0 = _mm_packus_epi16(dst0, dst0);
    dst1 = _mm_packus_epi16(dst1, dst1);
    dst2 = _mm_packus_epi16(dst2, dst2);
    dst3 = _mm_packus_epi16(dst3, dst3);
    // Store the results.
    if (do_two) {
      // Store eight bytes/pixels per line.
      _mm_storel_epi64((__m128i*)(dst + 0 * BPS), dst0);
      _mm_storel_epi64((__m128i*)(dst + 1 * BPS), dst1);
      _mm_storel_epi64((__m128i*)(dst + 2 * BPS), dst2);
      _mm_storel_epi64((__m128i*)(dst + 3 * BPS), dst3);
    } else {
      // Store four bytes/pixels per line.
      WebPInt32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(dst0));
      WebPInt32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(dst1));
      WebPInt32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(dst2));
      WebPInt32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(dst3));
    }
  }
}